

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQChar * sq_getfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)

{
  SQObjectType SVar1;
  SQClosure *pSVar2;
  SQFunctionProto *pSVar3;
  SQObjectPtr *pSVar4;
  
  if (idx < 0) {
    pSVar4 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar4 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar4->super_SQObject)._type;
  if (SVar1 == OT_NATIVECLOSURE) {
    pSVar2 = (pSVar4->super_SQObject)._unVal.pClosure;
    if (nval < pSVar2->_defaultparams) {
      SQVM::Push(v,pSVar2->_outervalues + nval);
      return "@NATIVE";
    }
  }
  else if (SVar1 == OT_CLOSURE) {
    pSVar2 = (pSVar4->super_SQObject)._unVal.pClosure;
    pSVar3 = pSVar2->_function;
    if (nval < (ulong)pSVar3->_noutervalues) {
      SQVM::Push(v,((pSVar2->_outervalues[nval].super_SQObject._unVal.pArray)->_values)._vals);
      return (SQChar *)&(pSVar3->_outervalues[nval]._name.super_SQObject._unVal.pTable)->_firstfree;
    }
  }
  return (SQChar *)0x0;
}

Assistant:

const SQChar *sq_getfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)
{
    SQObjectPtr &self=stack_get(v,idx);
    const SQChar *name = NULL;
    switch(sq_type(self))
    {
    case OT_CLOSURE:{
        SQClosure *clo = _closure(self);
        SQFunctionProto *fp = clo->_function;
        if(((SQUnsignedInteger)fp->_noutervalues) > nval) {
            v->Push(*(_outer(clo->_outervalues[nval])->_valptr));
            SQOuterVar &ov = fp->_outervalues[nval];
            name = _stringval(ov._name);
        }
                    }
        break;
    case OT_NATIVECLOSURE:{
        SQNativeClosure *clo = _nativeclosure(self);
        if(clo->_noutervalues > nval) {
            v->Push(clo->_outervalues[nval]);
            name = _SC("@NATIVE");
        }
                          }
        break;
    default: break; //shutup compiler
    }
    return name;
}